

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

ACT_TYPE __thiscall despot::POMCPPrior::GetAction(POMCPPrior *this,State *state)

{
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  
  (*this->_vptr_POMCPPrior[9])();
  uVar3 = (long)(this->preferred_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->preferred_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    uVar3 = (long)(this->legal_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->legal_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar3 == 0) {
      iVar1 = (*this->model_->_vptr_DSPOMDP[5])();
      iVar1 = Random::NextInt((Random *)&Random::RANDOM,iVar1);
      return iVar1;
    }
    iVar1 = Random::NextInt((Random *)&Random::RANDOM,(int)(uVar3 >> 2));
    piVar2 = (this->legal_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    iVar1 = Random::NextInt((Random *)&Random::RANDOM,(int)(uVar3 >> 2));
    piVar2 = (this->preferred_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return piVar2[iVar1];
}

Assistant:

ACT_TYPE POMCPPrior::GetAction(const State& state) {
	ComputePreference(state);

	if (preferred_actions_.size() != 0)
		return Random::RANDOM.NextElement(preferred_actions_);

	if (legal_actions_.size() != 0)
		return Random::RANDOM.NextElement(legal_actions_);

	return Random::RANDOM.NextInt(model_->NumActions());
}